

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnGlobalGetExpr
          (BinaryReaderInterp *this,Index global_index)

{
  Result RVar1;
  uint uVar2;
  Enum EVar3;
  reference pvVar4;
  Enum op;
  Location loc_1;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,global_index,&loc_1);
  RVar1 = SharedValidator::OnGlobalGet(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    pvVar4 = std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::at
                       (&this->global_types_,(ulong)global_index);
    uVar2 = *(int *)&(pvVar4->super_ExternType).field_0xc + 0x17;
    if (uVar2 < 8) {
      op = *(Enum *)(&DAT_001e3acc + (ulong)uVar2 * 4);
    }
    else {
      op = GlobalGet;
    }
    Istream::Emit(this->istream_,op,global_index);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnGlobalGetExpr(Index global_index) {
  CHECK_RESULT(
      validator_.OnGlobalGet(GetLocation(), Var(global_index, GetLocation())));

  Type type = global_types_.at(global_index).type;
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpGlobalGetRef, global_index);
  } else {
    istream_.Emit(Opcode::GlobalGet, global_index);
  }
  return Result::Ok;
}